

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void decode_token_recon_block(AV1Decoder *pbi,ThreadData *td,aom_reader *r,BLOCK_SIZE bsize)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  AV1_COMMON *cm_00;
  BLOCK_SIZE in_CL;
  byte bVar11;
  long lVar12;
  undefined8 in_RDX;
  DecoderCodingBlock *in_RSI;
  long in_RDI;
  int unit_width_1;
  int unit_height_1;
  int blk_col_1;
  int blk_row_1;
  int step;
  int block;
  int bw_var_tx;
  int bh_var_tx;
  TX_SIZE max_tx_size;
  BLOCK_SIZE plane_bsize;
  int ss_y;
  int ss_x;
  macroblockd_plane *pd_1;
  int plane_1;
  int mu_blocks_high_1;
  int mu_blocks_wide_1;
  BLOCK_SIZE max_unit_bsize_1;
  int col_1;
  int row_1;
  int max_blocks_high_1;
  int max_blocks_wide_1;
  int eobtotal;
  int blk_col;
  int blk_row;
  int unit_width;
  int unit_height;
  int stepc;
  int stepr;
  TX_SIZE tx_size;
  macroblockd_plane *pd;
  int plane;
  int mu_blocks_high;
  int mu_blocks_wide;
  BLOCK_SIZE max_unit_bsize;
  int max_blocks_high;
  int max_blocks_wide;
  int col;
  int row;
  MB_MODE_INFO *mbmi;
  int num_planes;
  MACROBLOCKD *xd;
  DecoderCodingBlock *dcb;
  AV1_COMMON *cm;
  int in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  MACROBLOCKD *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_e4;
  int local_e0;
  int local_d8;
  int local_b8;
  int local_a8;
  int local_a4;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int iVar13;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_70;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int iVar14;
  int local_54;
  MB_MODE_INFO *pMVar15;
  TX_SIZE in_stack_ffffffffffffffb8;
  DecoderCodingBlock *xd_00;
  DecoderCodingBlock *pDVar16;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3b60);
  xd_00 = in_RSI;
  iVar2 = av1_num_planes(cm_00);
  pMVar15 = *(xd_00->xd).mi;
  iVar3 = is_inter_block((MB_MODE_INFO *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  if (iVar3 == 0) {
    iVar3 = max_block_wide(&xd_00->xd,in_CL,0);
    iVar4 = max_block_high(&xd_00->xd,in_CL,0);
    local_f0 = iVar3;
    if (0xf < iVar3) {
      local_f0 = 0x10;
    }
    local_f4 = iVar4;
    if (0xf < iVar4) {
      local_f4 = 0x10;
    }
    for (local_54 = 0; local_54 < iVar4; local_54 = local_f4 + local_54) {
      for (iVar14 = 0; iVar14 < iVar3; iVar14 = local_f0 + iVar14) {
        local_70 = 0;
        while ((local_70 < iVar2 && ((local_70 == 0 || (((xd_00->xd).is_chroma_ref & 1U) != 0))))) {
          lVar12 = (long)local_70;
          pDVar16 = xd_00;
          bVar1 = av1_get_tx_size(in_stack_fffffffffffffee0,
                                  (MACROBLOCKD *)
                                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          uVar9 = (uint)bVar1 << 0x18;
          iVar10 = tx_size_high_unit[bVar1];
          iVar13 = tx_size_wide_unit[bVar1];
          local_f8 = iVar4;
          if (local_f4 + local_54 < iVar4) {
            local_f8 = local_f4 + local_54;
          }
          iVar5 = local_f8 + ((1 << ((byte)(xd_00->xd).plane[lVar12].subsampling_y & 0x1f)) >> 1) >>
                  ((byte)(xd_00->xd).plane[lVar12].subsampling_y & 0x1f);
          local_fc = iVar3;
          if (local_f0 + iVar14 < iVar3) {
            local_fc = local_f0 + iVar14;
          }
          iVar6 = local_fc + ((1 << ((byte)(xd_00->xd).plane[lVar12].subsampling_x & 0x1f)) >> 1) >>
                  ((byte)(xd_00->xd).plane[lVar12].subsampling_x & 0x1f);
          for (iVar7 = local_54 >> ((byte)(xd_00->xd).plane[lVar12].subsampling_y & 0x1f);
              iVar7 < iVar5; iVar7 = iVar10 + iVar7) {
            for (iVar8 = iVar14 >> ((byte)(xd_00->xd).plane[lVar12].subsampling_x & 0x1f);
                iVar8 < iVar6; iVar8 = iVar13 + iVar8) {
              (**(code **)(in_RSI[0x10].xd.cfl.ac_buf_q3 + 0x1c4))
                        (cm_00,in_RSI,in_RDX,local_70,iVar7,iVar8,uVar9 >> 0x18);
              (**(code **)(in_RSI[0x10].xd.cfl.ac_buf_q3 + 0x1c8))
                        (cm_00,in_RSI,in_RDX,local_70,iVar7,iVar8,uVar9 >> 0x18);
              set_cb_buffer_offsets(in_RSI,(TX_SIZE)(uVar9 >> 0x18),local_70);
            }
          }
          local_70 = local_70 + 1;
          xd_00 = pDVar16;
        }
      }
    }
  }
  else {
    (**(code **)(in_RSI[0x10].xd.cfl.ac_buf_q3 + 0x1d4))(cm_00,in_RSI,in_CL);
    if (pMVar15->skip_txfm == '\0') {
      iVar14 = 0;
      iVar3 = max_block_wide(&xd_00->xd,in_CL,0);
      iVar4 = max_block_high(&xd_00->xd,in_CL,0);
      local_100 = iVar3;
      if (0xf < iVar3) {
        local_100 = 0x10;
      }
      local_104 = iVar4;
      if (0xf < iVar4) {
        local_104 = 0x10;
      }
      for (local_a4 = 0; local_a4 < iVar4; local_a4 = local_104 + local_a4) {
        for (local_a8 = 0; local_a8 < iVar3; local_a8 = local_100 + local_a8) {
          local_b8 = 0;
          while ((local_b8 < iVar2 && ((local_b8 == 0 || (((xd_00->xd).is_chroma_ref & 1U) != 0)))))
          {
            iVar10 = (xd_00->xd).plane[local_b8].subsampling_x;
            iVar13 = (xd_00->xd).plane[local_b8].subsampling_y;
            get_plane_block_size(in_CL,iVar10,iVar13);
            uVar9 = get_vartx_max_txsize
                              ((MACROBLOCKD *)
                               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                               (BLOCK_SIZE)((uint)in_stack_fffffffffffffed4 >> 0x18),
                               in_stack_fffffffffffffed0);
            bVar1 = (byte)uVar9;
            iVar5 = tx_size_high_unit[bVar1];
            iVar6 = tx_size_wide_unit[bVar1];
            local_d8 = 0;
            iVar7 = tx_size_wide_unit[bVar1];
            iVar8 = tx_size_high_unit[bVar1];
            local_108 = iVar4;
            if (local_104 + local_a4 < iVar4) {
              local_108 = local_104 + local_a4;
            }
            bVar1 = (byte)iVar13;
            in_stack_fffffffffffffef4 = iVar3;
            if (local_100 + local_a8 < iVar3) {
              in_stack_fffffffffffffef4 = local_100 + local_a8;
            }
            bVar11 = (byte)iVar10;
            iVar10 = in_stack_fffffffffffffef4 + ((1 << (bVar11 & 0x1f)) >> 1);
            for (local_e0 = local_a4 >> (bVar1 & 0x1f);
                local_e0 < local_108 + ((1 << (bVar1 & 0x1f)) >> 1) >> (bVar1 & 0x1f);
                local_e0 = iVar5 + local_e0) {
              for (local_e4 = local_a8 >> (bVar11 & 0x1f); local_e4 < iVar10 >> (bVar11 & 0x1f);
                  local_e4 = iVar6 + local_e4) {
                in_stack_fffffffffffffee8 = (MACROBLOCKD *)&stack0xffffffffffffff68;
                in_stack_fffffffffffffee0 = uVar9 & 0xff;
                in_stack_fffffffffffffed0 = local_e4;
                in_stack_fffffffffffffed8 = local_d8;
                decode_reconstruct_tx
                          ((AV1_COMMON *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           (ThreadData *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (aom_reader *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffff6c,iVar14),iVar3,
                           (BLOCK_SIZE)((uint)iVar4 >> 0x18),in_stack_ffffffffffffffa0,
                           in_stack_ffffffffffffffa8,(int)pMVar15,in_stack_ffffffffffffffb8,
                           (int *)xd_00);
                local_d8 = iVar7 * iVar8 + local_d8;
              }
            }
            local_b8 = local_b8 + 1;
          }
        }
      }
    }
    (**(code **)(in_RSI[0x10].xd.cfl.ac_buf_q3 + 0x1d8))(cm_00,xd_00);
  }
  av1_visit_palette((AV1Decoder *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                    in_stack_fffffffffffffee8,
                    (aom_reader *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                    (palette_visitor_fn_t)
                    CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  return;
}

Assistant:

static inline void decode_token_recon_block(AV1Decoder *const pbi,
                                            ThreadData *const td, aom_reader *r,
                                            BLOCK_SIZE bsize) {
  AV1_COMMON *const cm = &pbi->common;
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *mbmi = xd->mi[0];

  if (!is_inter_block(mbmi)) {
    int row, col;
    assert(bsize == get_plane_block_size(bsize, xd->plane[0].subsampling_x,
                                         xd->plane[0].subsampling_y));
    const int max_blocks_wide = max_block_wide(xd, bsize, 0);
    const int max_blocks_high = max_block_high(xd, bsize, 0);
    const BLOCK_SIZE max_unit_bsize = BLOCK_64X64;
    int mu_blocks_wide = mi_size_wide[max_unit_bsize];
    int mu_blocks_high = mi_size_high[max_unit_bsize];
    mu_blocks_wide = AOMMIN(max_blocks_wide, mu_blocks_wide);
    mu_blocks_high = AOMMIN(max_blocks_high, mu_blocks_high);

    for (row = 0; row < max_blocks_high; row += mu_blocks_high) {
      for (col = 0; col < max_blocks_wide; col += mu_blocks_wide) {
        for (int plane = 0; plane < num_planes; ++plane) {
          if (plane && !xd->is_chroma_ref) break;
          const struct macroblockd_plane *const pd = &xd->plane[plane];
          const TX_SIZE tx_size = av1_get_tx_size(plane, xd);
          const int stepr = tx_size_high_unit[tx_size];
          const int stepc = tx_size_wide_unit[tx_size];

          const int unit_height = ROUND_POWER_OF_TWO(
              AOMMIN(mu_blocks_high + row, max_blocks_high), pd->subsampling_y);
          const int unit_width = ROUND_POWER_OF_TWO(
              AOMMIN(mu_blocks_wide + col, max_blocks_wide), pd->subsampling_x);

          for (int blk_row = row >> pd->subsampling_y; blk_row < unit_height;
               blk_row += stepr) {
            for (int blk_col = col >> pd->subsampling_x; blk_col < unit_width;
                 blk_col += stepc) {
              td->read_coeffs_tx_intra_block_visit(cm, dcb, r, plane, blk_row,
                                                   blk_col, tx_size);
              td->predict_and_recon_intra_block_visit(
                  cm, dcb, r, plane, blk_row, blk_col, tx_size);
              set_cb_buffer_offsets(dcb, tx_size, plane);
            }
          }
        }
      }
    }
  } else {
    td->predict_inter_block_visit(cm, dcb, bsize);
    // Reconstruction
    if (!mbmi->skip_txfm) {
      int eobtotal = 0;

      const int max_blocks_wide = max_block_wide(xd, bsize, 0);
      const int max_blocks_high = max_block_high(xd, bsize, 0);
      int row, col;

      const BLOCK_SIZE max_unit_bsize = BLOCK_64X64;
      assert(max_unit_bsize ==
             get_plane_block_size(BLOCK_64X64, xd->plane[0].subsampling_x,
                                  xd->plane[0].subsampling_y));
      int mu_blocks_wide = mi_size_wide[max_unit_bsize];
      int mu_blocks_high = mi_size_high[max_unit_bsize];

      mu_blocks_wide = AOMMIN(max_blocks_wide, mu_blocks_wide);
      mu_blocks_high = AOMMIN(max_blocks_high, mu_blocks_high);

      for (row = 0; row < max_blocks_high; row += mu_blocks_high) {
        for (col = 0; col < max_blocks_wide; col += mu_blocks_wide) {
          for (int plane = 0; plane < num_planes; ++plane) {
            if (plane && !xd->is_chroma_ref) break;
            const struct macroblockd_plane *const pd = &xd->plane[plane];
            const int ss_x = pd->subsampling_x;
            const int ss_y = pd->subsampling_y;
            const BLOCK_SIZE plane_bsize =
                get_plane_block_size(bsize, ss_x, ss_y);
            const TX_SIZE max_tx_size =
                get_vartx_max_txsize(xd, plane_bsize, plane);
            const int bh_var_tx = tx_size_high_unit[max_tx_size];
            const int bw_var_tx = tx_size_wide_unit[max_tx_size];
            int block = 0;
            int step =
                tx_size_wide_unit[max_tx_size] * tx_size_high_unit[max_tx_size];
            int blk_row, blk_col;
            const int unit_height = ROUND_POWER_OF_TWO(
                AOMMIN(mu_blocks_high + row, max_blocks_high), ss_y);
            const int unit_width = ROUND_POWER_OF_TWO(
                AOMMIN(mu_blocks_wide + col, max_blocks_wide), ss_x);

            for (blk_row = row >> ss_y; blk_row < unit_height;
                 blk_row += bh_var_tx) {
              for (blk_col = col >> ss_x; blk_col < unit_width;
                   blk_col += bw_var_tx) {
                decode_reconstruct_tx(cm, td, r, mbmi, plane, plane_bsize,
                                      blk_row, blk_col, block, max_tx_size,
                                      &eobtotal);
                block += step;
              }
            }
          }
        }
      }
    }
    td->cfl_store_inter_block_visit(cm, xd);
  }

  av1_visit_palette(pbi, xd, r, set_color_index_map_offset);
}